

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

Bool IsValidMediaExtension(ctmbstr sType)

{
  Bool BVar1;
  int iVar2;
  tmbchar local_38 [8];
  tmbchar ext [20];
  uint local_1c;
  uint i;
  ctmbstr sType_local;
  
  BVar1 = IsFilePath(sType);
  if (BVar1 != no) {
    GetFileExtension(sType,local_38,0x14);
    for (local_1c = 0; local_1c < 0x12; local_1c = local_1c + 1) {
      iVar2 = prvTidytmbstrcasecmp(local_38,mediaExtensions[local_1c]);
      if (iVar2 == 0) {
        return yes;
      }
    }
  }
  return no;
}

Assistant:

static Bool IsValidMediaExtension( ctmbstr sType )
{
    uint i;
    tmbchar ext[20];

    if ( !IsFilePath(sType) ) return 0;

    GetFileExtension( sType, ext, sizeof(ext) );

    for (i = 0; i < N_MEDIA_EXTS; i++)
    {
        if ( TY_(tmbstrcasecmp)(ext, mediaExtensions[i]) == 0 )
            return yes;
    }
    return no;
}